

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O2

int Cortex_CopyFrame(sFrameOfData *pSrc,sFrameOfData *pDst)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  tMarkerData *__ptr;
  short *__dest;
  tForceData *__dest_00;
  double *__dest_01;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = pSrc->nBodies;
  pDst->iFrame = pSrc->iFrame;
  pDst->nBodies = uVar1;
  uVar7 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 * 0xc0 - uVar7 != 0; uVar7 = uVar7 + 0xc0) {
    iVar3 = *(int *)(pSrc->BodyData[0].szName + uVar7 + 0x80);
    iVar2 = iVar3 * 0xc;
    pvVar4 = *(void **)((long)&pDst->BodyData[0].Markers + uVar7);
    if (*(int *)(pDst->BodyData[0].szName + uVar7 + 0x80) != iVar3) {
      pvVar4 = realloc(pvVar4,(long)iVar2);
      if ((0 < iVar2) && (pvVar4 == (void *)0x0)) goto LAB_00105965;
      *(int *)(pDst->BodyData[0].szName + uVar7 + 0x80) = iVar3;
      *(void **)((long)&pDst->BodyData[0].Markers + uVar7) = pvVar4;
    }
    memcpy(pvVar4,*(void **)((long)&pSrc->BodyData[0].Markers + uVar7),(long)iVar2);
    iVar3 = *(int *)((long)&pSrc->BodyData[0].nSegments + uVar7);
    iVar2 = iVar3 * 0x38;
    pvVar4 = *(void **)((long)&pDst->BodyData[0].Segments + uVar7);
    if (*(int *)((long)&pDst->BodyData[0].nSegments + uVar7) != iVar3) {
      pvVar4 = realloc(pvVar4,(long)iVar2);
      if ((0 < iVar2) && (pvVar4 == (void *)0x0)) goto LAB_00105965;
      *(int *)((long)&pDst->BodyData[0].nSegments + uVar7) = iVar3;
      *(void **)((long)&pDst->BodyData[0].Segments + uVar7) = pvVar4;
    }
    memcpy(pvVar4,*(void **)((long)&pSrc->BodyData[0].Segments + uVar7),(long)iVar2);
    iVar2 = *(int *)((long)&pSrc->BodyData[0].nDofs + uVar7);
    iVar3 = iVar2 * 8;
    pvVar4 = *(void **)((long)&pDst->BodyData[0].Dofs + uVar7);
    if (*(int *)((long)&pDst->BodyData[0].nDofs + uVar7) != iVar2) {
      pvVar4 = realloc(pvVar4,(long)iVar3);
      if ((0 < iVar3) && (pvVar4 == (void *)0x0)) goto LAB_00105965;
      *(int *)((long)&pDst->BodyData[0].nDofs + uVar7) = iVar2;
      *(void **)((long)&pDst->BodyData[0].Dofs + uVar7) = pvVar4;
    }
    memcpy(pvVar4,*(void **)((long)&pSrc->BodyData[0].Dofs + uVar7),(long)iVar3);
    *(undefined4 *)((long)&pDst->BodyData[0].fAvgDofResidual + uVar7) =
         *(undefined4 *)((long)&pSrc->BodyData[0].fAvgDofResidual + uVar7);
    *(undefined8 *)((long)&pDst->BodyData[0].nIterations + uVar7) =
         *(undefined8 *)((long)&pSrc->BodyData[0].nIterations + uVar7);
    *(undefined4 *)((long)&pDst->BodyData[0].FocusEncoderValue + uVar7) =
         *(undefined4 *)((long)&pSrc->BodyData[0].FocusEncoderValue + uVar7);
  }
  iVar3 = pSrc->nUnidentifiedMarkers;
  iVar2 = iVar3 * 0xc;
  __ptr = pDst->UnidentifiedMarkers;
  if (pDst->nUnidentifiedMarkers == iVar3) {
LAB_00105805:
    memcpy(__ptr,pSrc->UnidentifiedMarkers,(long)iVar2);
    iVar3 = (pSrc->AnalogData).nAnalogChannels;
    iVar2 = (pSrc->AnalogData).nAnalogSamples;
    iVar5 = iVar3 * iVar2 * 2;
    if (((pDst->AnalogData).nAnalogChannels == iVar3) &&
       ((pDst->AnalogData).nAnalogSamples == iVar2)) {
      __dest = (pDst->AnalogData).AnalogSamples;
    }
    else {
      __dest = (short *)realloc((pDst->AnalogData).AnalogSamples,(long)iVar5);
      if (__dest == (short *)0x0 && 0 < iVar5) goto LAB_00105965;
      (pDst->AnalogData).nAnalogChannels = iVar3;
      (pDst->AnalogData).nAnalogSamples = iVar2;
      (pDst->AnalogData).AnalogSamples = __dest;
    }
    memcpy(__dest,(pSrc->AnalogData).AnalogSamples,(long)iVar5);
    iVar3 = (pSrc->AnalogData).nForcePlates;
    iVar2 = (pSrc->AnalogData).nForceSamples;
    iVar5 = iVar3 * iVar2 * 0x1c;
    if (((pDst->AnalogData).nForcePlates == iVar3) && ((pDst->AnalogData).nForceSamples == iVar2)) {
      __dest_00 = (pDst->AnalogData).Forces;
    }
    else {
      __dest_00 = (tForceData *)realloc((pDst->AnalogData).Forces,(long)iVar5);
      if (__dest_00 == (tForceData *)0x0 && 0 < iVar5) goto LAB_00105965;
      (pDst->AnalogData).nForcePlates = iVar3;
      (pDst->AnalogData).nForceSamples = iVar2;
      (pDst->AnalogData).Forces = __dest_00;
    }
    memcpy(__dest_00,(pSrc->AnalogData).Forces,(long)iVar5);
    iVar3 = (pSrc->AnalogData).nAngleEncoders;
    iVar2 = (pSrc->AnalogData).nAngleEncoderSamples;
    iVar5 = iVar3 * iVar2 * 8;
    if (((pDst->AnalogData).nAngleEncoders == iVar3) &&
       ((pDst->AnalogData).nAngleEncoderSamples == iVar2)) {
      __dest_01 = (pDst->AnalogData).AngleEncoderSamples;
    }
    else {
      __dest_01 = (double *)realloc((pDst->AnalogData).AngleEncoderSamples,(long)iVar5);
      if (__dest_01 == (double *)0x0 && 0 < iVar5) goto LAB_00105965;
      (pDst->AnalogData).nAngleEncoders = iVar3;
      (pDst->AnalogData).nAngleEncoderSamples = iVar2;
      (pDst->AnalogData).AngleEncoderSamples = __dest_01;
    }
    memcpy(__dest_01,(pSrc->AnalogData).AngleEncoderSamples,(long)iVar5);
    iVar3 = 0;
  }
  else {
    __ptr = (tMarkerData *)realloc(__ptr,(long)iVar2);
    if (__ptr != (tMarkerData *)0x0 || iVar2 < 1) {
      pDst->nUnidentifiedMarkers = iVar3;
      pDst->UnidentifiedMarkers = __ptr;
      goto LAB_00105805;
    }
LAB_00105965:
    Cortex_FreeFrame(pDst);
    iVar3 = 5;
  }
  return iVar3;
}

Assistant:

int Cortex_CopyFrame(const sFrameOfData* pSrc, sFrameOfData* pDst)
{
  int iBody;
  int nBodies = pSrc->nBodies;
  const sBodyData* SrcBody;
  sBodyData* DstBody;

  int n;
  void *ptr;
  int size;

  pDst->iFrame = pSrc->iFrame;

  pDst->nBodies = nBodies;

  for (iBody = 0; iBody < nBodies; iBody++) {
    SrcBody = &pSrc->BodyData[iBody];
    DstBody = &pDst->BodyData[iBody];

    // Copy Markers

    n = SrcBody->nMarkers;
    size = n * sizeof(tMarkerData);

    if (DstBody->nMarkers != n) {
      ptr = realloc(DstBody->Markers, size);
      if (size > 0 && ptr == NULL) {
        Cortex_FreeFrame(pDst);
        return RC_MemoryError;
      }
      DstBody->nMarkers = n;
      DstBody->Markers = (tMarkerData*) ptr;
    }

    memcpy(DstBody->Markers, SrcBody->Markers, size);

    // Copy Segments

    n = SrcBody->nSegments;
    size = n * sizeof(tSegmentData);

    if (DstBody->nSegments != n) {
      ptr = realloc(DstBody->Segments, size);
      if (size > 0 && ptr == NULL) {
        Cortex_FreeFrame(pDst);
        return RC_MemoryError;
      }
      DstBody->nSegments = n;
      DstBody->Segments = (tSegmentData*) ptr;
    }

    memcpy(DstBody->Segments, SrcBody->Segments, size);

    // Copy DOFs

    n = SrcBody->nDofs;
    size = n * sizeof(tDofData);

    if (DstBody->nDofs != n) {
      ptr = realloc(DstBody->Dofs, size);
      if (size > 0 && ptr == NULL) {
        Cortex_FreeFrame(pDst);
        return RC_MemoryError;
      }
      DstBody->nDofs = n;
      DstBody->Dofs = (tDofData*) ptr;
    }

    memcpy(DstBody->Dofs, SrcBody->Dofs, size);

    // Copy extra items
    DstBody->fAvgDofResidual = SrcBody->fAvgDofResidual;
    DstBody->nIterations = SrcBody->nIterations;
    DstBody->ZoomEncoderValue = SrcBody->ZoomEncoderValue;
    DstBody->FocusEncoderValue = SrcBody->FocusEncoderValue;
  }

  // Copy Unidentified Markers

  n = pSrc->nUnidentifiedMarkers;
  size = n * sizeof(tMarkerData);

  if (pDst->nUnidentifiedMarkers != n) {
    ptr = realloc(pDst->UnidentifiedMarkers, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    pDst->nUnidentifiedMarkers = n;
    pDst->UnidentifiedMarkers = (tMarkerData*) ptr;
  }

  memcpy(pDst->UnidentifiedMarkers, pSrc->UnidentifiedMarkers, size);

  // Copy Analog

  const sAnalogData* SrcAnalog = &pSrc->AnalogData;
  sAnalogData* DstAnalog = &pDst->AnalogData;

  // Analog Channels

  int nChannels = SrcAnalog->nAnalogChannels;
  int nSamples = SrcAnalog->nAnalogSamples;

  size = nChannels * nSamples * sizeof(short);

  if (DstAnalog->nAnalogChannels != nChannels || DstAnalog->nAnalogSamples
      != nSamples) {
    ptr = realloc(DstAnalog->AnalogSamples, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    DstAnalog->nAnalogChannels = nChannels;
    DstAnalog->nAnalogSamples = nSamples;
    DstAnalog->AnalogSamples = (short*) ptr;
  }

  memcpy(DstAnalog->AnalogSamples, SrcAnalog->AnalogSamples, size);

  // Forces Data

  int nForcePlates = SrcAnalog->nForcePlates;
  int nForceSamples = SrcAnalog->nForceSamples;

  size = nForcePlates * nForceSamples * sizeof(tForceData);

  if (DstAnalog->nForcePlates != nForcePlates || DstAnalog->nForceSamples
      != nForceSamples) {
    ptr = realloc(DstAnalog->Forces, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    DstAnalog->nForcePlates = nForcePlates;
    DstAnalog->nForceSamples = nForceSamples;
    DstAnalog->Forces = (tForceData*) ptr;
  }

  memcpy(DstAnalog->Forces, SrcAnalog->Forces, size);

  int nAngleEncoders = SrcAnalog->nAngleEncoders;
  int nAngleEncoderSamples = SrcAnalog->nAngleEncoderSamples;

  size = nAngleEncoders * nAngleEncoderSamples * sizeof(double);

  if (DstAnalog->nAngleEncoders != nAngleEncoders
      || DstAnalog->nAngleEncoderSamples != nAngleEncoderSamples) {
    ptr = realloc(DstAnalog->AngleEncoderSamples, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    DstAnalog->nAngleEncoders = nAngleEncoders;
    DstAnalog->nAngleEncoderSamples = nAngleEncoderSamples;
    DstAnalog->AngleEncoderSamples = (double*) ptr;
  }

  memcpy(DstAnalog->AngleEncoderSamples, SrcAnalog->AngleEncoderSamples, size);

  return RC_Okay;
}